

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::SetUseUtf8StringEscaping(Printer *this,bool as_utf8)

{
  FastFieldValuePrinter *local_60;
  bool as_utf8_local;
  Printer *this_local;
  
  if (as_utf8) {
    local_60 = (FastFieldValuePrinter *)operator_new(8);
    (((DebugStringFieldValuePrinter *)&local_60->_vptr_FastFieldValuePrinter)->
    super_FastFieldValuePrinter)._vptr_FastFieldValuePrinter = (_func_int **)0x0;
    FastFieldValuePrinterUtf8Escaping::FastFieldValuePrinterUtf8Escaping
              ((FastFieldValuePrinterUtf8Escaping *)local_60);
  }
  else {
    local_60 = (FastFieldValuePrinter *)operator_new(8);
    ((FastFieldValuePrinter *)&local_60->_vptr_FastFieldValuePrinter)->_vptr_FastFieldValuePrinter =
         (_func_int **)0x0;
    DebugStringFieldValuePrinter::DebugStringFieldValuePrinter
              ((DebugStringFieldValuePrinter *)local_60);
  }
  SetDefaultFieldValuePrinter(this,local_60);
  return;
}

Assistant:

void TextFormat::Printer::SetUseUtf8StringEscaping(bool as_utf8) {
  SetDefaultFieldValuePrinter(as_utf8 ? new FastFieldValuePrinterUtf8Escaping()
                                      : new DebugStringFieldValuePrinter());
}